

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O2

void __thiscall
slang::ast::PrimitiveInstanceSymbol::visitExprs<slang::ast::CheckerMemberVisitor&>
          (PrimitiveInstanceSymbol *this,CheckerMemberVisitor *visitor)

{
  long lVar1;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar2;
  
  sVar2 = getPortConnections(this);
  for (lVar1 = 0; sVar2._M_extent._M_extent_value._M_extent_value << 3 != lVar1; lVar1 = lVar1 + 8)
  {
    Expression::visit<slang::ast::CheckerMemberVisitor&>
              (*(Expression **)((long)sVar2._M_ptr + lVar1),visitor);
  }
  return;
}

Assistant:

void PrimitiveInstanceSymbol::visitExprs(TVisitor&& visitor) const {
    for (auto conn : getPortConnections())
        conn->visit(visitor);
}